

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void verifyOrthonormal<Imath_3_2::Matrix44<double>>
               (Matrix44<double> *A,BaseType_conflict3 threshold)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 *puVar20;
  long lVar21;
  long lVar22;
  double dStack_d0;
  double dStack_b0;
  double dStack_a0;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar1 = A->x[1][0];
  dVar2 = A->x[3][0];
  dVar3 = A->x[1][1];
  dVar4 = A->x[3][1];
  dVar5 = A->x[1][2];
  dVar6 = A->x[3][2];
  dVar7 = A->x[1][3];
  dVar8 = A->x[3][3];
  local_50 = dVar7 * dVar8 + dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
  dVar9 = A->x[2][1];
  auVar13._8_4_ = SUB84(dVar4,0);
  auVar13._0_8_ = dVar9;
  auVar13._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar10 = A->x[2][0];
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = dVar10;
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  dVar11 = A->x[2][2];
  auVar15._8_4_ = SUB84(dVar6,0);
  auVar15._0_8_ = dVar11;
  auVar15._12_4_ = (int)((ulong)dVar6 >> 0x20);
  dVar12 = A->x[2][3];
  dVar16 = A->x[0][1];
  dVar17 = A->x[0][0];
  dVar18 = A->x[0][2];
  dVar19 = A->x[0][3];
  local_68 = dVar7 * dVar19 + dVar5 * dVar18 + dVar1 * dVar17 + dVar3 * dVar16;
  dStack_a0 = auVar13._8_8_;
  dStack_d0 = auVar14._8_8_;
  dStack_b0 = auVar15._8_8_;
  local_78 = dVar19 * dVar12 + dVar18 * dVar11 + dVar17 * dVar10 + dVar16 * dVar9;
  dStack_70 = dVar19 * dVar8 + dVar18 * dStack_b0 + dVar17 * dStack_d0 + dVar16 * dStack_a0;
  puVar20 = local_88;
  local_88._8_4_ = SUB84(local_68,0);
  local_88._0_8_ = dVar19 * dVar19 + dVar18 * dVar18 + dVar17 * dVar17 + dVar16 * dVar16;
  local_88._12_4_ = (int)((ulong)local_68 >> 0x20);
  dStack_58 = dVar12 * dVar7 + dVar11 * dVar5 + dVar10 * dVar1 + dVar9 * dVar3;
  local_60 = dVar7 * dVar7 + dVar5 * dVar5 + dVar1 * dVar1 + dVar3 * dVar3;
  local_48 = local_78;
  dStack_40 = dStack_58;
  dStack_30 = dVar12 * dVar8 + dVar11 * dStack_b0 + dVar10 * dStack_d0 + dVar9 * dStack_a0;
  local_38 = dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10 + dVar9 * dVar9;
  local_28 = dStack_70;
  local_20 = local_50;
  local_18 = dStack_30;
  local_10 = dVar8 * dVar8 + dVar6 * dVar6 + dVar2 * dVar2 + dVar4 * dVar4;
  lVar21 = 0;
  do {
    lVar22 = 0;
    do {
      if (lVar21 == lVar22) {
        if (threshold <= ABS(*(double *)(puVar20 + lVar22 * 8) + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<double>]"
                       );
        }
      }
      else if (threshold <= ABS(*(double *)(puVar20 + lVar22 * 8))) {
        __assert_fail("std::abs (prod[i][j]) < threshold",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                      ,0x3e,
                      "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<double>]"
                     );
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 4);
    lVar21 = lVar21 + 1;
    puVar20 = puVar20 + 0x20;
  } while (lVar21 != 4);
  return;
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}